

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall chrono::fea::ChContactTriangleXYZ::IsSubBlockActive(ChContactTriangleXYZ *this)

{
  int in_ESI;
  
  IsSubBlockActive((ChContactTriangleXYZ *)
                   ((long)&(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                           _vptr_ChContactable +
                   (long)(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                         _vptr_ChContactable[-0xd]),in_ESI);
  return;
}

Assistant:

bool ChContactTriangleXYZ::IsSubBlockActive(int nblock) const {
    if (nblock == 0)
        return !GetNode1()->GetFixed();
    if (nblock == 1)
        return !GetNode2()->GetFixed();
    if (nblock == 2)
        return !GetNode3()->GetFixed();

    return false;
}